

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmtp_engine.cpp
# Opt level: O0

handshake_fun_t
zmq::zmtp_engine_t::select_handshake_fun(bool unversioned_,uchar revision_,uchar minor_)

{
  uchar minor__local;
  uchar revision__local;
  bool unversioned__local;
  code *local_10;
  
  if (unversioned_) {
    local_10 = handshake_v1_0_unversioned;
  }
  else if (revision_ == '\0') {
    local_10 = handshake_v1_0;
  }
  else if (revision_ == '\x01') {
    local_10 = handshake_v2_0;
  }
  else if (revision_ == '\x03') {
    if (minor_ == '\0') {
      local_10 = handshake_v3_0;
    }
    else {
      local_10 = handshake_v3_1;
    }
  }
  else {
    local_10 = handshake_v3_1;
  }
  return (handshake_fun_t)local_10;
}

Assistant:

zmq::zmtp_engine_t::handshake_fun_t zmq::zmtp_engine_t::select_handshake_fun (
  bool unversioned_, unsigned char revision_, unsigned char minor_)
{
    //  Is the peer using ZMTP/1.0 with no revision number?
    if (unversioned_) {
        return &zmtp_engine_t::handshake_v1_0_unversioned;
    }
    switch (revision_) {
        case ZMTP_1_0:
            return &zmtp_engine_t::handshake_v1_0;
        case ZMTP_2_0:
            return &zmtp_engine_t::handshake_v2_0;
        case ZMTP_3_x:
            switch (minor_) {
                case 0:
                    return &zmtp_engine_t::handshake_v3_0;
                default:
                    return &zmtp_engine_t::handshake_v3_1;
            }
        default:
            return &zmtp_engine_t::handshake_v3_1;
    }
}